

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall common_log::resume(common_log *this)

{
  thread local_20;
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  
  std::mutex::lock(&this->mtx);
  if (this->running == false) {
    this->running = true;
    local_18.this = this;
    std::thread::thread<common_log::resume()::_lambda()_1_,,void>(&local_20,&local_18);
    std::thread::operator=(&this->thrd,&local_20);
    std::thread::~thread(&local_20);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void resume() {
        std::lock_guard<std::mutex> lock(mtx);

        if (running) {
            return;
        }

        running = true;

        thrd = std::thread([this]() {
            while (true) {
                {
                    std::unique_lock<std::mutex> lock(mtx);
                    cv.wait(lock, [this]() { return head != tail; });

                    cur = entries[head];

                    head = (head + 1) % entries.size();
                }

                if (cur.is_end) {
                    break;
                }

                cur.print(); // stdout and stderr

                if (file) {
                    cur.print(file);
                }
            }
        });
    }